

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O1

Uint32 Diligent::FindImmutableSampler
                 (ImmutableSamplerDesc *ImtblSamplers,Uint32 NumImtblSamplers,
                 SHADER_TYPE ShaderStages,char *ResourceName,char *SamplerSuffix)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  string *unaff_R15;
  string msg;
  string local_60;
  char *local_40;
  char *local_38;
  
  local_40 = ResourceName;
  local_38 = SamplerSuffix;
  if ((ResourceName == (char *)0x0) || (*ResourceName == '\0')) {
    unaff_R15 = &local_60;
    FormatString<char[26],char[51]>
              (unaff_R15,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResourceName != nullptr && ResourceName[0] != \'\\0\'",
               (char (*) [51])ResourceName);
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"FindImmutableSampler",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x14e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if (NumImtblSamplers != 0) {
    uVar3 = 0;
    do {
      bVar1 = true;
      if (((ImtblSamplers->ShaderStages & ShaderStages) != SHADER_TYPE_UNKNOWN) &&
         (bVar2 = StreqSuff(local_40,ImtblSamplers->SamplerOrTextureName,local_38,false), bVar2)) {
        if ((ShaderStages & ~ImtblSamplers->ShaderStages) != SHADER_TYPE_UNKNOWN) {
          FormatString<char[63],char_const*,char[95]>
                    (&local_60,
                     (Diligent *)"Immutable sampler uses only some of the stages that resource \'",
                     (char (*) [63])&local_40,
                     (char **)
                     "\' is defined for. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                     ,(char (*) [95])SamplerSuffix);
          DebugAssertionFailed
                    (local_60._M_dataplus._M_p,"FindImmutableSampler",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                     ,0x156);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
        }
        bVar1 = false;
        unaff_R15 = (string *)(uVar3 & 0xffffffff);
      }
      if (!bVar1) {
        return (Uint32)unaff_R15;
      }
      uVar3 = uVar3 + 1;
      ImtblSamplers = ImtblSamplers + 1;
    } while (NumImtblSamplers != uVar3);
  }
  return 0xffffffff;
}

Assistant:

Uint32 FindImmutableSampler(const ImmutableSamplerDesc ImtblSamplers[],
                            Uint32                     NumImtblSamplers,
                            SHADER_TYPE                ShaderStages,
                            const char*                ResourceName,
                            const char*                SamplerSuffix)
{
    VERIFY_EXPR(ResourceName != nullptr && ResourceName[0] != '\0');
    for (Uint32 s = 0; s < NumImtblSamplers; ++s)
    {
        const ImmutableSamplerDesc& Sam = ImtblSamplers[s];
        if (((Sam.ShaderStages & ShaderStages) != 0) && StreqSuff(ResourceName, Sam.SamplerOrTextureName, SamplerSuffix))
        {
            VERIFY((Sam.ShaderStages & ShaderStages) == ShaderStages,
                   "Immutable sampler uses only some of the stages that resource '", ResourceName,
                   "' is defined for. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
            return s;
        }
    }

    return InvalidImmutableSamplerIndex;
}